

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QVariant * __thiscall QGraphicsItem::data(QGraphicsItem *this,int key)

{
  bool bVar1;
  QVariant *defaultValue;
  QHash<const_QGraphicsItem_*,_QMap<int,_QVariant>_> *in_RSI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dataStore>_> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItemCustomDataStore *store;
  QHash<const_QGraphicsItem_*,_QMap<int,_QVariant>_> *this_00;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dataStore>_> *this_01;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  this_01 = in_RDI;
  defaultValue = (QVariant *)
                 QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dataStore>_>::
                 operator()(in_RDI);
  bVar1 = QHash<const_QGraphicsItem_*,_QMap<int,_QVariant>_>::contains
                    (in_RSI,(QGraphicsItem **)in_RDI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    QHash<const_QGraphicsItem_*,_QMap<int,_QVariant>_>::value
              (this_00,(QGraphicsItem **)defaultValue);
    ::QVariant::QVariant((QVariant *)0x9847a2);
    QMap<int,_QVariant>::value((QMap<int,_QVariant> *)this_01,(int *)this_00,defaultValue);
    ::QVariant::~QVariant(&local_28);
    QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)0x9847ce);
  }
  else {
    ::QVariant::QVariant((QVariant *)0x984778);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QVariant *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGraphicsItem::data(int key) const
{
    QGraphicsItemCustomDataStore *store = qt_dataStore();
    if (!store->data.contains(this))
        return QVariant();
    return store->data.value(this).value(key);
}